

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cpp
# Opt level: O0

void anon_unknown.dwarf_aa8::GetF0CandidateContourSub
               (double **interpolated_f0_set,int f0_length,double f0_floor,double f0_ceil,
               double boundary_f0,double *f0_candidate)

{
  int local_4c;
  int i;
  double lower;
  double upper;
  double *f0_candidate_local;
  double boundary_f0_local;
  double f0_ceil_local;
  double f0_floor_local;
  int f0_length_local;
  double **interpolated_f0_set_local;
  
  for (local_4c = 0; local_4c < f0_length; local_4c = local_4c + 1) {
    f0_candidate[local_4c] =
         ((*interpolated_f0_set)[local_4c] + interpolated_f0_set[1][local_4c] +
          interpolated_f0_set[2][local_4c] + interpolated_f0_set[3][local_4c]) / 4.0;
    if ((((boundary_f0 * 1.1 < f0_candidate[local_4c]) ||
         (f0_candidate[local_4c] < boundary_f0 * 0.9)) || (f0_ceil < f0_candidate[local_4c])) ||
       (f0_candidate[local_4c] < f0_floor)) {
      f0_candidate[local_4c] = 0.0;
    }
  }
  return;
}

Assistant:

static void GetF0CandidateContourSub(const double * const *interpolated_f0_set,
    int f0_length, double f0_floor, double f0_ceil, double boundary_f0,
    double *f0_candidate) {
  double upper = boundary_f0 * 1.1;
  double lower = boundary_f0 * 0.9;
  for (int i = 0; i < f0_length; ++i) {
    f0_candidate[i] = (interpolated_f0_set[0][i] +
      interpolated_f0_set[1][i] + interpolated_f0_set[2][i] +
      interpolated_f0_set[3][i]) / 4.0;

    if (f0_candidate[i] > upper || f0_candidate[i] < lower ||
        f0_candidate[i] > f0_ceil || f0_candidate[i] < f0_floor)
      f0_candidate[i] = 0.0;
  }
}